

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool multicastMembershipHelper
               (QNativeSocketEnginePrivate *d,int how6,int how4,QHostAddress *groupAddress,
               QNetworkInterface *interface)

{
  bool bVar1;
  NetworkLayerProtocol NVar2;
  quint32 qVar3;
  uint32_t uVar4;
  ErrorString errorString;
  char *pcVar5;
  const_iterator o;
  int *piVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  QNetworkInterface *in_R8;
  long in_FS_OFFSET;
  int res;
  QNetworkAddressEntry *entry;
  QList<QNetworkAddressEntry> *__range4;
  bool found;
  int sockArgSize;
  void *sockArg;
  int sockOpt;
  int level;
  QHostAddress ip;
  const_iterator __end4;
  const_iterator __begin4;
  QList<QNetworkAddressEntry> addressEntries;
  ip_mreq mreq4;
  Q_IPV6ADDR ip6;
  ipv6_mreq mreq6;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ErrorString in_stack_ffffffffffffff38;
  SocketError in_stack_ffffffffffffff3c;
  uint uVar7;
  QNativeSocketEnginePrivate *in_stack_ffffffffffffff40;
  bool *in_stack_ffffffffffffff48;
  bool *ok;
  uint in_stack_ffffffffffffff50;
  socklen_t __optlen;
  undefined8 *local_a8;
  int local_a0;
  int local_9c;
  byte local_71;
  const_iterator local_58;
  bool local_50 [28];
  undefined8 local_34;
  undefined1 local_2c [16];
  undefined8 local_1c;
  undefined8 local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0xaaaaaaaaaaaaaaaa;
  local_1c = 0xaaaaaaaaaaaaaaaa;
  local_14 = 0xaaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  NVar2 = QHostAddress::protocol((QHostAddress *)0x35ac2a);
  if (NVar2 == IPv6Protocol) {
    local_9c = 0x29;
    local_a8 = &local_1c;
    __optlen = 0x14;
    pcVar5 = (char *)0x0;
    memset(&local_1c,0,0x14);
    local_2c._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_2c._0_8_ = 0xaaaaaaaaaaaaaaaa;
    local_2c = (undefined1  [16])
               QHostAddress::toIPv6Address
                         ((QHostAddress *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_1c = local_2c._0_8_;
    local_14 = local_2c._8_8_;
    pcVar5 = QNetworkInterface::index(in_R8,pcVar5,local_2c._8_4_);
    local_c = SUB84(pcVar5,0);
    local_a0 = in_ESI;
  }
  else {
    NVar2 = QHostAddress::protocol((QHostAddress *)0x35ace4);
    if (NVar2 != IPv4Protocol) {
      QNativeSocketEnginePrivate::setError
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      local_71 = 0;
      goto LAB_0035afd1;
    }
    local_9c = 0;
    local_a8 = &local_34;
    __optlen = 8;
    memset(&local_34,0,8);
    qVar3 = QHostAddress::toIPv4Address
                      ((QHostAddress *)CONCAT44(__optlen,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
    uVar4 = htonl(qVar3);
    local_34 = CONCAT44(local_34._4_4_,uVar4);
    bVar1 = QNetworkInterface::isValid
                      ((QNetworkInterface *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    local_a0 = in_EDX;
    if (bVar1) {
      local_50[0] = true;
      local_50[1] = true;
      local_50[2] = true;
      local_50[3] = true;
      local_50[4] = true;
      local_50[5] = true;
      local_50[6] = true;
      local_50[7] = true;
      local_50[8] = true;
      local_50[9] = true;
      local_50[10] = true;
      local_50[0xb] = true;
      local_50[0xc] = true;
      local_50[0xd] = true;
      local_50[0xe] = true;
      local_50[0xf] = true;
      local_50[0x10] = true;
      local_50[0x11] = true;
      local_50[0x12] = true;
      local_50[0x13] = true;
      local_50[0x14] = true;
      local_50[0x15] = true;
      local_50[0x16] = true;
      local_50[0x17] = true;
      QNetworkInterface::addressEntries
                ((QNetworkInterface *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
      ;
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 & 0xffffff;
      ok = local_50;
      local_58.i = (QNetworkAddressEntry *)0xaaaaaaaaaaaaaaaa;
      local_58 = QList<QNetworkAddressEntry>::begin
                           ((QList<QNetworkAddressEntry> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      o = QList<QNetworkAddressEntry>::end
                    ((QList<QNetworkAddressEntry> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      while (bVar1 = QList<QNetworkAddressEntry>::const_iterator::operator!=(&local_58,o), bVar1) {
        in_stack_ffffffffffffff40 =
             (QNativeSocketEnginePrivate *)
             QList<QNetworkAddressEntry>::const_iterator::operator*(&local_58);
        QNetworkAddressEntry::ip
                  ((QNetworkAddressEntry *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        NVar2 = QHostAddress::protocol((QHostAddress *)0x35ae5c);
        if (NVar2 == IPv4Protocol) {
          qVar3 = QHostAddress::toIPv4Address
                            ((QHostAddress *)CONCAT44(__optlen,in_stack_ffffffffffffff50),ok);
          uVar4 = htonl(qVar3);
          local_34 = CONCAT44(uVar4,(undefined4)local_34);
          in_stack_ffffffffffffff50 = CONCAT13(1,(int3)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff3c = HostNotFoundError;
        }
        else {
          in_stack_ffffffffffffff3c = ConnectionRefusedError;
        }
        QHostAddress::~QHostAddress((QHostAddress *)0x35ae9e);
        if (in_stack_ffffffffffffff3c != ConnectionRefusedError) break;
        QList<QNetworkAddressEntry>::const_iterator::operator++(&local_58);
      }
      bVar1 = (in_stack_ffffffffffffff50 & 0x1000000) == 0;
      if (bVar1) {
        QNativeSocketEnginePrivate::setError
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        local_71 = 0;
      }
      uVar7 = (uint)bVar1;
      QList<QNetworkAddressEntry>::~QList((QList<QNetworkAddressEntry> *)0x35aefd);
      if (uVar7 != 0) goto LAB_0035afd1;
      in_stack_ffffffffffffff3c = ConnectionRefusedError;
    }
    else {
      local_34 = local_34 & 0xffffffff;
    }
  }
  errorString = setsockopt((int)*(undefined8 *)(in_RDI + 0xd8),local_9c,local_a0,local_a8,__optlen);
  if (errorString == UnknownSocketErrorString) {
    piVar6 = __errno_location();
    if (*piVar6 == 0x5c) {
      QNativeSocketEnginePrivate::setError
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,errorString);
    }
    else if (*piVar6 == 99) {
      QNativeSocketEnginePrivate::setError
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,errorString);
    }
    else {
      QNativeSocketEnginePrivate::setError
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,errorString);
    }
    local_71 = 0;
  }
  else {
    local_71 = 1;
  }
LAB_0035afd1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_71 & 1);
}

Assistant:

static bool multicastMembershipHelper(QNativeSocketEnginePrivate *d,
                                      int how6,
                                      int how4,
                                      const QHostAddress &groupAddress,
                                      const QNetworkInterface &interface)
{
    int level = 0;
    int sockOpt = 0;
    void *sockArg;
    int sockArgSize;

    ip_mreq mreq4;
    ipv6_mreq mreq6;

    if (groupAddress.protocol() == QAbstractSocket::IPv6Protocol) {
        level = IPPROTO_IPV6;
        sockOpt = how6;
        sockArg = &mreq6;
        sockArgSize = sizeof(mreq6);
        memset(&mreq6, 0, sizeof(mreq6));
        Q_IPV6ADDR ip6 = groupAddress.toIPv6Address();
        memcpy(&mreq6.ipv6mr_multiaddr, &ip6, sizeof(ip6));
        mreq6.ipv6mr_interface = interface.index();
    } else if (groupAddress.protocol() == QAbstractSocket::IPv4Protocol) {
        level = IPPROTO_IP;
        sockOpt = how4;
        sockArg = &mreq4;
        sockArgSize = sizeof(mreq4);
        memset(&mreq4, 0, sizeof(mreq4));
        mreq4.imr_multiaddr.s_addr = htonl(groupAddress.toIPv4Address());

        if (interface.isValid()) {
            const QList<QNetworkAddressEntry> addressEntries = interface.addressEntries();
            bool found = false;
            for (const QNetworkAddressEntry &entry : addressEntries) {
                const QHostAddress ip = entry.ip();
                if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                    mreq4.imr_interface.s_addr = htonl(ip.toIPv4Address());
                    found = true;
                    break;
                }
            }
            if (!found) {
                d->setError(QAbstractSocket::NetworkError,
                            QNativeSocketEnginePrivate::NetworkUnreachableErrorString);
                return false;
            }
        } else {
            mreq4.imr_interface.s_addr = INADDR_ANY;
        }
    } else {
        // unreachable
        d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                    QNativeSocketEnginePrivate::ProtocolUnsupportedErrorString);
        return false;
    }

    int res = setsockopt(d->socketDescriptor, level, sockOpt, sockArg, sockArgSize);
    if (res == -1) {
        switch (errno) {
        case ENOPROTOOPT:
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                        QNativeSocketEnginePrivate::OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            d->setError(QAbstractSocket::SocketAddressNotAvailableError,
                        QNativeSocketEnginePrivate::AddressNotAvailableErrorString);
            break;
        default:
            d->setError(QAbstractSocket::UnknownSocketError,
                        QNativeSocketEnginePrivate::UnknownSocketErrorString);
            break;
        }
        return false;
    }
    return true;
}